

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  ParamIterator<int> *in_RDI;
  bool dummy [2];
  bool at_end;
  undefined1 local_21;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar2 = 0;
  uVar1 = 1;
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
              *)0x64db13);
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
              *)0x64db26);
  uVar1 = ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>
          ::operator==((ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>
                        *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(in_stack_fffffffffffffff5,
                                                           CONCAT14(uVar1,in_stack_fffffffffffffff0)
                                                          ))),
                       (ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>
                        *)in_RDI);
  local_21 = true;
  if (!(bool)uVar1) {
    uVar2 = uVar1;
    uVar3 = uVar1;
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
                *)0x64db73);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::FuncParam<void(*)(yv12_buffer_config_const*,macroblockd_const*,BLOCK_SIZE,int,int,int,double_const*,mv_const*,int_const*,int,int,int,unsigned_char_const*,unsigned_int*,unsigned_short*)>>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
                *)0x64db85);
    local_21 = ParamIterator<int>::operator==
                         ((ParamIterator<int> *)
                          CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_fffffffffffffff0)))),in_RDI);
  }
  return local_21;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }